

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O0

void Hacl_Impl_Ed25519_PointAdd_point_add(uint64_t *out,uint64_t *p,uint64_t *q1)

{
  uint64_t *puVar1;
  uint64_t *__src;
  uint64_t *__src_00;
  uint64_t *__src_01;
  uint64_t *in_RDX;
  uint64_t *in_RSI;
  uint64_t *in_RDI;
  uint64_t *t3;
  uint64_t *z3;
  uint64_t *y3;
  uint64_t *x3;
  uint64_t *tmp6;
  uint64_t *tmp5;
  uint64_t *tmp4;
  uint64_t *tmp12;
  uint64_t *tmp61;
  uint64_t *tmp51;
  uint64_t *tmp41;
  uint64_t *tmp3;
  uint64_t *tmp2;
  uint64_t *tmp11;
  uint64_t *t2;
  uint64_t *z2;
  uint64_t *t1;
  uint64_t *z1;
  uint64_t *tmp60;
  uint64_t *tmp50;
  uint64_t *tmp31;
  uint64_t *tmp21;
  uint64_t *tmp10;
  uint64_t *y2;
  uint64_t *x2;
  uint64_t *y1;
  uint64_t *x1;
  uint64_t *tmp40;
  uint64_t *tmp30;
  uint64_t *tmp20;
  uint64_t *tmp1;
  uint64_t tmp [30];
  uint64_t *in_stack_fffffffffffffdf8;
  uint64_t *in_stack_fffffffffffffe00;
  uint64_t *in_stack_fffffffffffffe18;
  uint64_t *in_stack_fffffffffffffe20;
  uint64_t *in_stack_fffffffffffffe48;
  uint64_t *in_stack_fffffffffffffe50;
  undefined1 local_108 [40];
  undefined1 auStack_e0 [40];
  undefined1 auStack_b8 [120];
  undefined1 auStack_40 [40];
  uint64_t *local_18;
  uint64_t *local_10;
  uint64_t *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_108,0,0xf0);
  puVar1 = Hacl_Impl_Ed25519_ExtPoint_getx(local_10);
  __src = Hacl_Impl_Ed25519_ExtPoint_gety(local_10);
  __src_00 = Hacl_Impl_Ed25519_ExtPoint_getx(local_18);
  __src_01 = Hacl_Impl_Ed25519_ExtPoint_gety(local_18);
  memcpy(local_108,puVar1,0x28);
  memcpy(auStack_e0,__src_00,0x28);
  Hacl_Bignum25519_fdifference_reduced(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Hacl_Bignum25519_fdifference(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Hacl_Bignum25519_fmul(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(uint64_t *)0x10e92e);
  memcpy(local_108,__src,0x28);
  memcpy(auStack_e0,__src_01,0x28);
  Hacl_Bignum25519_fsum(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Hacl_Bignum25519_fsum(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Hacl_Bignum25519_fmul(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(uint64_t *)0x10e9a9);
  Hacl_Impl_Ed25519_ExtPoint_getz(local_10);
  Hacl_Impl_Ed25519_ExtPoint_gett(local_10);
  Hacl_Impl_Ed25519_ExtPoint_getz(local_18);
  Hacl_Impl_Ed25519_ExtPoint_gett(local_18);
  Hacl_Bignum25519_times_2d(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Hacl_Bignum25519_fmul(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(uint64_t *)0x10ea8d);
  Hacl_Bignum25519_times_2(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Hacl_Bignum25519_fmul(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(uint64_t *)0x10eabf);
  memcpy(local_108,auStack_b8,0x28);
  memcpy(auStack_40,auStack_e0,0x28);
  Hacl_Bignum25519_fdifference_reduced(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Hacl_Bignum25519_fdifference(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Hacl_Bignum25519_fsum(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Hacl_Bignum25519_fsum(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Hacl_Impl_Ed25519_ExtPoint_getx(local_8);
  Hacl_Impl_Ed25519_ExtPoint_gety(local_8);
  Hacl_Impl_Ed25519_ExtPoint_getz(local_8);
  puVar1 = Hacl_Impl_Ed25519_ExtPoint_gett(local_8);
  Hacl_Bignum25519_fmul(puVar1,in_stack_fffffffffffffdf8,(uint64_t *)0x10ec35);
  Hacl_Bignum25519_fmul(puVar1,in_stack_fffffffffffffdf8,(uint64_t *)0x10ec49);
  Hacl_Bignum25519_fmul(puVar1,in_stack_fffffffffffffdf8,(uint64_t *)0x10ec5d);
  Hacl_Bignum25519_fmul(puVar1,in_stack_fffffffffffffdf8,(uint64_t *)0x10ec71);
  return;
}

Assistant:

static void Hacl_Impl_Ed25519_PointAdd_point_add(uint64_t *out, uint64_t *p, uint64_t *q1)
{
  uint64_t tmp[30U] = { 0U };
  uint64_t *tmp1 = tmp;
  uint64_t *tmp20 = tmp + (uint32_t)5U;
  uint64_t *tmp30 = tmp + (uint32_t)10U;
  uint64_t *tmp40 = tmp + (uint32_t)15U;
  uint64_t *x1 = Hacl_Impl_Ed25519_ExtPoint_getx(p);
  uint64_t *y1 = Hacl_Impl_Ed25519_ExtPoint_gety(p);
  uint64_t *x2 = Hacl_Impl_Ed25519_ExtPoint_getx(q1);
  uint64_t *y2 = Hacl_Impl_Ed25519_ExtPoint_gety(q1);
  memcpy(tmp1, x1, (uint32_t)5U * sizeof x1[0U]);
  memcpy(tmp20, x2, (uint32_t)5U * sizeof x2[0U]);
  Hacl_Bignum25519_fdifference_reduced(tmp1, y1);
  Hacl_Bignum25519_fdifference(tmp20, y2);
  Hacl_Bignum25519_fmul(tmp30, tmp1, tmp20);
  memcpy(tmp1, y1, (uint32_t)5U * sizeof y1[0U]);
  memcpy(tmp20, y2, (uint32_t)5U * sizeof y2[0U]);
  Hacl_Bignum25519_fsum(tmp1, x1);
  Hacl_Bignum25519_fsum(tmp20, x2);
  Hacl_Bignum25519_fmul(tmp40, tmp1, tmp20);
  uint64_t *tmp10 = tmp;
  uint64_t *tmp21 = tmp + (uint32_t)5U;
  uint64_t *tmp31 = tmp + (uint32_t)10U;
  uint64_t *tmp50 = tmp + (uint32_t)20U;
  uint64_t *tmp60 = tmp + (uint32_t)25U;
  uint64_t *z1 = Hacl_Impl_Ed25519_ExtPoint_getz(p);
  uint64_t *t1 = Hacl_Impl_Ed25519_ExtPoint_gett(p);
  uint64_t *z2 = Hacl_Impl_Ed25519_ExtPoint_getz(q1);
  uint64_t *t2 = Hacl_Impl_Ed25519_ExtPoint_gett(q1);
  Hacl_Bignum25519_times_2d(tmp10, t1);
  Hacl_Bignum25519_fmul(tmp21, tmp10, t2);
  Hacl_Bignum25519_times_2(tmp10, z1);
  Hacl_Bignum25519_fmul(tmp50, tmp10, z2);
  memcpy(tmp10, tmp31, (uint32_t)5U * sizeof tmp31[0U]);
  memcpy(tmp60, tmp21, (uint32_t)5U * sizeof tmp21[0U]);
  uint64_t *tmp11 = tmp;
  uint64_t *tmp2 = tmp + (uint32_t)5U;
  uint64_t *tmp3 = tmp + (uint32_t)10U;
  uint64_t *tmp41 = tmp + (uint32_t)15U;
  uint64_t *tmp51 = tmp + (uint32_t)20U;
  uint64_t *tmp61 = tmp + (uint32_t)25U;
  Hacl_Bignum25519_fdifference_reduced(tmp11, tmp41);
  Hacl_Bignum25519_fdifference(tmp61, tmp51);
  Hacl_Bignum25519_fsum(tmp51, tmp2);
  Hacl_Bignum25519_fsum(tmp41, tmp3);
  uint64_t *tmp12 = tmp;
  uint64_t *tmp4 = tmp + (uint32_t)15U;
  uint64_t *tmp5 = tmp + (uint32_t)20U;
  uint64_t *tmp6 = tmp + (uint32_t)25U;
  uint64_t *x3 = Hacl_Impl_Ed25519_ExtPoint_getx(out);
  uint64_t *y3 = Hacl_Impl_Ed25519_ExtPoint_gety(out);
  uint64_t *z3 = Hacl_Impl_Ed25519_ExtPoint_getz(out);
  uint64_t *t3 = Hacl_Impl_Ed25519_ExtPoint_gett(out);
  Hacl_Bignum25519_fmul(x3, tmp12, tmp6);
  Hacl_Bignum25519_fmul(y3, tmp5, tmp4);
  Hacl_Bignum25519_fmul(t3, tmp12, tmp4);
  Hacl_Bignum25519_fmul(z3, tmp5, tmp6);
}